

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O3

void __thiscall
NumberTemp::PropagateTempPropertyTransferStoreDependencies
          (NumberTemp *this,SymID usedSymID,PropertySym *propertySym,BackwardPass *backwardPass)

{
  code *pcVar1;
  bool bVar2;
  SymID dstSymID;
  undefined4 *puVar3;
  BVSparse<Memory::JitArenaAllocator> **ppBVar4;
  Type_conflict pBVar5;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  char *this_01;
  BVSparse<Memory::JitArenaAllocator> *this_02;
  
  if (this->nonTempElemLoad == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x305,"(!this->nonTempElemLoad)","!this->nonTempElemLoad");
    if (!bVar2) goto LAB_006317cc;
    *puVar3 = 0;
  }
  this_01 = (char *)&this->upwardExposedMarkTempObjectLiveFields;
  BVSparse<Memory::JitArenaAllocator>::Clear
            ((BVSparse<Memory::JitArenaAllocator> *)this_01,(propertySym->super_Sym).m_id);
  if (this->propertyIdsTempTransferDependencies ==
      (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
    return;
  }
  if ((this->super_TempTrackerBase).tempTransferDependencies ==
      (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
    ;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x30f,"(this->tempTransferDependencies != nullptr)",
                       "this->tempTransferDependencies != nullptr");
    if (!bVar2) {
LAB_006317cc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  dstSymID = GetRepresentativePropertySymId((NumberTemp *)this_01,propertySym,backwardPass);
  TempTrackerBase::AddTransferDependencies
            (&this->super_TempTrackerBase,usedSymID,dstSymID,
             (this->super_TempTrackerBase).tempTransferDependencies);
  ppBVar4 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Get
                      (this->propertyIdsTempTransferDependencies,propertySym->m_propertyId);
  if (ppBVar4 == (BVSparse<Memory::JitArenaAllocator> **)0x0) {
    this_02 = &this->elemLoadDependencies;
    pBVar5 = (Type_conflict)this_02;
    do {
      pBVar5 = pBVar5->next;
      if (pBVar5 == (Type_conflict)0x0) {
        return;
      }
    } while ((pBVar5->data).word == 0);
  }
  else {
    this_02 = *ppBVar4;
  }
  ppBVar4 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::
            FindOrInsertNew((this->super_TempTrackerBase).tempTransferDependencies,usedSymID);
  if (*ppBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    this_00 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                        (this_02,(this->super_TempTrackerBase).nonTempSyms.alloc);
    *ppBVar4 = this_00;
  }
  else {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>(*ppBVar4,this_02);
    this_00 = *ppBVar4;
  }
  if (this_02 != &this->elemLoadDependencies) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (this_00,&this->elemLoadDependencies);
    this_00 = *ppBVar4;
  }
  BVSparse<Memory::JitArenaAllocator>::Set(this_00,(propertySym->super_Sym).m_id);
  return;
}

Assistant:

void
NumberTemp::PropagateTempPropertyTransferStoreDependencies(SymID usedSymID, PropertySym * propertySym, BackwardPass * backwardPass)
{
    Assert(!this->nonTempElemLoad);
    upwardExposedMarkTempObjectLiveFields.Clear(propertySym->m_id);

    if (!this->IsInLoop())
    {
        // Don't need to track dependencies outside of loop, as we already marked the
        // use as temp transfer already and we won't have a case where the "dst" is reused again (outside of loop)
        return;
    }

    Assert(this->tempTransferDependencies != nullptr);
    SymID dstSymID = this->GetRepresentativePropertySymId(propertySym, backwardPass);
    AddTransferDependencies(usedSymID, dstSymID, this->tempTransferDependencies);

    Js::PropertyId storedPropertyId = propertySym->m_propertyId;
    // The symbol this properties are transferred to
    BVSparse<JitArenaAllocator> ** pPropertyTransferDependencies = this->propertyIdsTempTransferDependencies->Get(storedPropertyId);
    BVSparse<JitArenaAllocator> * transferDependencies = nullptr;
    if (pPropertyTransferDependencies == nullptr)
    {
        if (elemLoadDependencies.IsEmpty())
        {
            // No dependencies to transfer
            return;
        }

        transferDependencies = &elemLoadDependencies;
    }
    else
    {
        transferDependencies = *pPropertyTransferDependencies;
    }

    BVSparse<JitArenaAllocator> ** pBVSparse = this->tempTransferDependencies->FindOrInsertNew(usedSymID);
    if (*pBVSparse == nullptr)
    {
        *pBVSparse = transferDependencies->CopyNew(this->GetAllocator());
    }
    else
    {
        (*pBVSparse)->Or(transferDependencies);
    }

    if (transferDependencies != &elemLoadDependencies)
    {
        // Always include the element load dependencies as well
        (*pBVSparse)->Or(&elemLoadDependencies);
    }

    // Track the propertySym as well for the case where the dependence is not carried by the use
    // Loop1
    //      o.x = e
    //      Loop2
    //              f = o.x
    //                = f
    //              e = e + blah
    // Here, although we can detect that e and f has dependent relationship, f's life time doesn't cross with e's.
    // But o.x will keep the value of e alive, so e can't be mark temp because o.x is still in use (not f)
    // We will add the property sym int he dependency set and check with the upward exposed mark temp object live fields
    // that we keep track of in NumberTemp
    (*pBVSparse)->Set(propertySym->m_id);
}